

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O1

void __thiscall
cfd::core::ElementsConfidentialAddress::CalculateAddress
          (ElementsConfidentialAddress *this,Address *unblinded_address,
          ConfidentialKey *confidential_key)

{
  _Base_ptr *pp_Var1;
  string *psVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  uint32_t uVar5;
  CfdException *pCVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *wally_string;
  string *key;
  int ret;
  char *output;
  AddressFormatData data;
  string hrp;
  string address;
  int local_13c [5];
  undefined1 local_128 [32];
  WallyUtil *local_108;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  CfdSourceLocation local_d0;
  string local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_78;
  string *local_70;
  Address *local_68;
  vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
  local_60 [2];
  
  bVar4 = Pubkey::IsValid(confidential_key);
  if (!bVar4) {
    local_d0.filename = "cfdcore_elements_address.cpp";
    local_d0.line = 0xf0;
    local_d0.funcname = "CalculateAddress";
    Pubkey::GetHex_abi_cxx11_((string *)&local_100,confidential_key);
    Pubkey::GetData((ByteData *)&local_b0,confidential_key);
    local_128._0_8_ = ByteData::GetDataSize((ByteData *)&local_b0);
    logger::log<std::__cxx11::string&,unsigned_long&>
              (&local_d0,kCfdLogLevelWarning,
               "CalculateAddress error. Confidential key is invalid. : confidential_key={}, size={}."
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
               (unsigned_long *)local_128);
    if (local_b0._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pp_Var1 = &local_100._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((_Base_ptr *)local_100._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)local_100._M_impl._0_8_);
    }
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_100._M_impl._0_8_ = pp_Var1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"CalculateAddress error. Confidential key is invalid.","");
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_100);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar4 = Pubkey::IsCompress(confidential_key);
  if (!bVar4) {
    local_d0.filename = "cfdcore_elements_address.cpp";
    local_d0.line = 0xfb;
    local_d0.funcname = "CalculateAddress";
    Pubkey::GetHex_abi_cxx11_((string *)&local_100,confidential_key);
    Pubkey::GetData((ByteData *)&local_b0,confidential_key);
    local_128._0_8_ = ByteData::GetDataSize((ByteData *)&local_b0);
    logger::log<std::__cxx11::string&,unsigned_long&>
              (&local_d0,kCfdLogLevelWarning,
               "CalculateAddress error. Confidential key is not compressed. : confidential_key={}, size={}."
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
               (unsigned_long *)local_128);
    if (local_b0._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pp_Var1 = &local_100._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((_Base_ptr *)local_100._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)local_100._M_impl._0_8_);
    }
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_100._M_impl._0_8_ = pp_Var1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"CalculateAddress error. Confidential key is not compressed.",""
              );
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_100);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  Pubkey::GetData((ByteData *)&local_100,confidential_key);
  ByteData::GetBytes(&local_90,(ByteData *)&local_100);
  if ((pointer)local_100._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_100._M_impl._0_8_);
  }
  local_108 = (WallyUtil *)0x0;
  local_13c[0] = -1;
  local_d0.filename = (char *)&local_d0.funcname;
  local_d0.line = 0;
  local_d0._12_4_ = 0;
  local_d0.funcname = (char *)((ulong)local_d0.funcname & 0xffffffffffffff00);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_100,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&unblinded_address->format_data_);
  core::Address::GetAddress_abi_cxx11_(&local_b0,unblinded_address);
  local_68 = unblinded_address;
  GetBlindKeyPair();
  if (local_60[0].
      super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60[0].
      super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_70 = (string *)&this->address_;
    local_78 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->confidential_key_;
    key = &(local_60[0].
            super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
            ._M_impl.super__Vector_impl_data._M_start)->blinded_prefix_key;
    do {
      local_108 = (WallyUtil *)0x0;
      if (*(char *)&key[1]._M_dataplus._M_p == '\x01') {
        AddressFormatData::GetString((string *)local_128,(AddressFormatData *)&local_100,key);
        ::std::__cxx11::string::operator=((string *)&local_d0,(string *)local_128);
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_);
        }
        _Var3._M_p = local_b0._M_dataplus._M_p;
        AddressFormatData::GetString((string *)local_128,(AddressFormatData *)&local_100,key + -1);
        local_13c[0] = wally_confidential_addr_from_addr_segwit
                                 (_Var3._M_p,local_128._0_8_,local_d0.filename,
                                  local_90.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_90.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_90.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,&local_108);
        wally_string = extraout_RDX;
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_);
          wally_string = extraout_RDX_00;
        }
        if (local_13c[0] != 0) {
          local_128._0_8_ = "cfdcore_elements_address.cpp";
          local_128._8_4_ = 0x118;
          local_128._16_8_ = "CalculateAddress";
          logger::log<int&>((CfdSourceLocation *)local_128,kCfdLogLevelTrace,"fail libwally. ret={}"
                            ,local_13c);
          wally_string = extraout_RDX_01;
        }
      }
      else {
        uVar5 = AddressFormatData::GetValue((AddressFormatData *)&local_100,key);
        local_13c[0] = wally_confidential_addr_from_addr
                                 (local_b0._M_dataplus._M_p,uVar5,
                                  local_90.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_90.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_90.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,&local_108);
        wally_string = extraout_RDX_02;
        if (local_13c[0] != 0) {
          local_128._0_8_ = "cfdcore_elements_address.cpp";
          local_128._8_4_ = 0x120;
          local_128._16_8_ = "CalculateAddress";
          logger::log<int&>((CfdSourceLocation *)local_128,kCfdLogLevelTrace,"fail libwally. ret={}"
                            ,local_13c);
          wally_string = extraout_RDX_03;
        }
      }
      if (local_13c[0] == 0) {
        WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)local_128,local_108,wally_string);
        ::std::__cxx11::string::operator=(local_70,(string *)local_128);
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_);
        }
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (local_78,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            confidential_key);
        core::Address::operator=(&this->unblinded_address_,local_68);
        ::std::
        vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
        ::~vector(local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_100);
        if ((char **)local_d0.filename != &local_d0.funcname) {
          operator_delete(local_d0.filename);
        }
        if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
      psVar2 = key + 1;
      key = (string *)&key[2]._M_string_length;
    } while ((pointer)&psVar2->_M_string_length !=
             local_60[0].
             super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ::std::
  vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
  ::~vector(local_60);
  local_128._0_8_ = "cfdcore_elements_address.cpp";
  local_128._8_4_ = 0x133;
  local_128._16_8_ = "CalculateAddress";
  logger::log<std::__cxx11::string&>
            ((CfdSourceLocation *)local_128,kCfdLogLevelWarning,
             "CalculateAddress error. Address prefix not found. : address={}.",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  local_128._0_8_ = local_128 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,"CalculateAddress address prefix not found.","");
  CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_128);
  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ElementsConfidentialAddress::CalculateAddress(
    const Address& unblinded_address,
    const ConfidentialKey& confidential_key) {
  if (!confidential_key.IsValid()) {
    warn(
        CFD_LOG_SOURCE,
        "CalculateAddress error. Confidential key is invalid."
        " : confidential_key={}, size={}.",
        confidential_key.GetHex(), confidential_key.GetData().GetDataSize());
    throw CfdException(
        kCfdIllegalArgumentError,
        "CalculateAddress error. Confidential key is invalid.");
  }
  // 33bytes: ConfidentialKey
  if (!confidential_key.IsCompress()) {
    warn(
        CFD_LOG_SOURCE,
        "CalculateAddress error. Confidential key is not compressed."
        " : confidential_key={}, size={}.",
        confidential_key.GetHex(), confidential_key.GetData().GetDataSize());
    throw CfdException(
        kCfdIllegalArgumentError,
        "CalculateAddress error. Confidential key is not compressed.");
  }

  const std::vector<uint8_t>& pubkey_data =
      confidential_key.GetData().GetBytes();
  char* output = nullptr;

  int ret = -1;
  uint32_t prefix;
  std::string hrp;
  AddressFormatData data = unblinded_address.GetAddressFormatData();
  std::string address = unblinded_address.GetAddress();
  for (const auto& format : GetBlindKeyPair()) {
    try {
      output = nullptr;

      // Get confidential_key
      if (format.is_segwit) {
        hrp = data.GetString(format.blinded_prefix_key);
        ret = wally_confidential_addr_from_addr_segwit(
            address.c_str(), data.GetString(format.prefix_key).c_str(),
            hrp.c_str(), pubkey_data.data(), pubkey_data.size(), &output);
        if (ret != WALLY_OK) {
          trace(CFD_LOG_SOURCE, "fail libwally. ret={}", ret);
        }
      } else {
        prefix = data.GetValue(format.blinded_prefix_key);
        ret = wally_confidential_addr_from_addr(
            address.c_str(), prefix, pubkey_data.data(), pubkey_data.size(),
            &output);
        if (ret != WALLY_OK) {
          trace(CFD_LOG_SOURCE, "fail libwally. ret={}", ret);
        }
      }

      if (ret == WALLY_OK) {
        address_ = WallyUtil::ConvertStringAndFree(output);
        confidential_key_ = confidential_key;
        unblinded_address_ = unblinded_address;
        return;
      }
    } catch (const CfdException& except) {
      // Ignore
      trace(
          CFD_LOG_SOURCE, "CalculateAddress exception={}",
          std::string(except.what()));
    }
  }

  warn(
      CFD_LOG_SOURCE,
      "CalculateAddress error. Address prefix not found."
      " : address={}.",
      address);
  throw CfdException(
      kCfdIllegalArgumentError, "CalculateAddress address prefix not found.");
}